

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O0

void absl::lts_20250127::base_internal::LLA_SkiplistInsert
               (AllocList *head,AllocList *e,AllocList **prev)

{
  int local_24;
  int i;
  AllocList **prev_local;
  AllocList *e_local;
  AllocList *head_local;
  
  LLA_SkiplistSearch(head,e,prev);
  while (head->levels < e->levels) {
    prev[head->levels] = head;
    head->levels = head->levels + 1;
  }
  for (local_24 = 0; local_24 != e->levels; local_24 = local_24 + 1) {
    e->next[local_24] = prev[local_24]->next[local_24];
    prev[local_24]->next[local_24] = e;
  }
  return;
}

Assistant:

static void LLA_SkiplistInsert(AllocList *head, AllocList *e,
                               AllocList **prev) {
  LLA_SkiplistSearch(head, e, prev);
  for (; head->levels < e->levels; head->levels++) {  // extend prev pointers
    prev[head->levels] = head;                        // to all *e's levels
  }
  for (int i = 0; i != e->levels; i++) {  // add element to list
    e->next[i] = prev[i]->next[i];
    prev[i]->next[i] = e;
  }
}